

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.cpp
# Opt level: O0

void calc<float>(options2f *opt)

{
  result_t f_00;
  result_t f_01;
  result_t f_02;
  result_t rVar1;
  result_t beta_00;
  result_t beta_01;
  result_t f_03;
  result_t beta_02;
  bool bVar2;
  invalid_argument *piVar3;
  ostream *poVar4;
  ostream *poVar5;
  ostream *poVar6;
  long in_RDI;
  root_type rVar7;
  real_t in_stack_000001a8;
  real_t in_stack_000001ac;
  real_t in_stack_000001b0;
  real_t in_stack_000001b4;
  uint_t in_stack_000001b8;
  uint_t in_stack_000001c0;
  result_t beta;
  result_t f;
  real_t h;
  real_t t;
  real_t dT;
  real_t Tmax;
  real_t Tmin;
  real_t Jy;
  real_t Jx;
  char *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdcc;
  float in_stack_fffffffffffffde0;
  float in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffdf4;
  real_t in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  ostream *in_stack_fffffffffffffe10;
  real_t in_stack_fffffffffffffe18;
  undefined4 uStack_1e4;
  undefined1 local_1c0 [20];
  float in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  real_t in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined8 in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  real_t in_stack_fffffffffffffea8;
  undefined4 uStack_154;
  real_t local_150;
  undefined1 local_148 [40];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  real_t local_100;
  undefined1 local_f8 [40];
  undefined1 local_d0 [8];
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  result_t local_80;
  undefined1 local_5c [36];
  undefined4 local_38;
  float local_34;
  int local_30;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  long local_8;
  
  local_8 = in_RDI;
  local_c = convert<float>((string *)0x104970);
  local_10 = convert<float>((string *)0x10498a);
  bVar2 = std::operator==(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if (!bVar2) {
    bVar2 = std::operator==(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    if (!bVar2) {
      local_14 = convert<float>((string *)0x104a12);
      local_18 = convert<float>((string *)0x104a2c);
      local_1c = convert<float>((string *)0x104a49);
      goto LAB_00104a52;
    }
  }
  local_1c = ising::tc::square<float>(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0);
  local_18 = local_1c;
  local_14 = local_1c;
LAB_00104a52:
  if ((local_14 < 0.0) || (local_18 < 0.0)) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Temperature should be positive");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (local_18 < local_14) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Tmax should be larger than Tmin");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (local_1c <= 0.0) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"dT should be positive");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::scientific);
  local_30 = (int)std::setprecision(6);
  poVar4 = std::operator<<(poVar4,(_Setprecision)local_30);
  poVar4 = std::operator<<(poVar4,"# lattice: square\n");
  poVar4 = std::operator<<(poVar4,"# precision: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,6);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar4,"# Lx Ly Jx Jy T 1/T F/N E/N C/N M2/N2\n");
  for (local_34 = local_14; local_34 < local_1c * 0.0001 + local_18; local_34 = local_1c + local_34)
  {
    local_38 = 0;
    ising::free_energy::square::transfer_matrix<float>::calc
              (in_stack_000001c0,in_stack_000001b8,in_stack_000001b4,in_stack_000001b0,
               in_stack_000001ac,in_stack_000001a8);
    ising::free_energy::square::transfer_matrix<float>::result_t::set(&local_80,0,1.0 / local_34);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(ulong *)(local_8 + 8));
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ulong *)(local_8 + 0x10));
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c);
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_34);
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1.0 / local_34);
    poVar4 = std::operator<<(poVar4,' ');
    memcpy(local_a8,local_5c,0x24);
    memcpy(local_d0,&local_80,0x24);
    f_00.derivatives_[0][2] = (real_t)(undefined4)local_98;
    f_00.derivatives_[1][0] = (real_t)local_98._4_4_;
    f_00.derivatives_[0][0] = (real_t)(undefined4)uStack_a0;
    f_00.derivatives_[0][1] = (real_t)uStack_a0._4_4_;
    f_00.derivatives_[1][1] = (real_t)(int)uStack_90;
    f_00.derivatives_[1][2] = (real_t)(int)((ulong)uStack_90 >> 0x20);
    f_00.derivatives_[2][0] = (real_t)local_88;
    f_00.derivatives_[2][1] = (real_t)in_stack_fffffffffffffdcc;
    f_00.derivatives_[2][2] = local_d0._0_4_;
    rVar1.derivatives_[0][2] = (real_t)(int)local_c0;
    rVar1.derivatives_[0][0] = (real_t)(undefined4)uStack_c8;
    rVar1.derivatives_[0][1] = (real_t)uStack_c8._4_4_;
    rVar1.derivatives_[1][0] = (real_t)(int)((ulong)local_c0 >> 0x20);
    rVar1.derivatives_[1][1] = (real_t)(undefined4)uStack_b8;
    rVar1.derivatives_[1][2] = (real_t)uStack_b8._4_4_;
    rVar1.derivatives_[2][0] = (real_t)local_b0;
    rVar1.derivatives_[2][1] = (real_t)in_stack_fffffffffffffdf4;
    rVar1.derivatives_[2][2] = in_stack_fffffffffffffdf8;
    rVar7 = ising::free_energy::
            free_energy<ising::free_energy::square::transfer_matrix<float>::result_t,ising::free_energy::square::transfer_matrix<float>::result_t,float>
                      (f_00,rVar1,0.0);
    poVar5 = (ostream *)std::ostream::operator<<(poVar4,rVar7);
    poVar5 = std::operator<<(poVar5,' ');
    memcpy(local_f8,local_5c,0x24);
    memcpy(&local_120,&local_80,0x24);
    f_01.derivatives_[0][2] = (real_t)(undefined4)uStack_118;
    f_01.derivatives_[1][0] = (real_t)uStack_118._4_4_;
    f_01.derivatives_[0][0] = (real_t)(undefined4)local_120;
    f_01.derivatives_[0][1] = (real_t)local_120._4_4_;
    f_01.derivatives_[1][1] = (real_t)(int)local_110;
    f_01.derivatives_[1][2] = (real_t)(int)((ulong)local_110 >> 0x20);
    f_01.derivatives_[2][0] = (real_t)(undefined4)uStack_108;
    f_01.derivatives_[2][1] = (real_t)uStack_108._4_4_;
    f_01.derivatives_[2][2] = local_100;
    beta_00.derivatives_[0][1] = (real_t)in_stack_fffffffffffffdfc;
    beta_00.derivatives_[0][0] = in_stack_fffffffffffffdf8;
    beta_00.derivatives_._8_8_ = poVar4;
    beta_00.derivatives_[1]._4_8_ = poVar5;
    beta_00.derivatives_[2]._0_8_ = in_stack_fffffffffffffe10;
    beta_00.derivatives_[2][2] = in_stack_fffffffffffffe18;
    rVar7 = ising::free_energy::
            energy<ising::free_energy::square::transfer_matrix<float>::result_t,ising::free_energy::square::transfer_matrix<float>::result_t,float>
                      (f_01,beta_00,SUB84(local_f8._24_8_,4));
    poVar6 = (ostream *)std::ostream::operator<<(poVar5,rVar7);
    in_stack_fffffffffffffe10 = std::operator<<(poVar6,' ');
    memcpy(local_148,local_5c,0x24);
    memcpy(&stack0xfffffffffffffe90,&local_80,0x24);
    f_02.derivatives_[2][1] = (real_t)uStack_154;
    f_02.derivatives_[2][0] = in_stack_fffffffffffffea8;
    f_02.derivatives_[0][2] = (real_t)(int)in_stack_fffffffffffffe98;
    f_02.derivatives_[1][0] = (real_t)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    f_02.derivatives_[0][0] = (real_t)(int)in_stack_fffffffffffffe90;
    f_02.derivatives_[0][1] = (real_t)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
    f_02.derivatives_[1][1] = (real_t)(int)in_stack_fffffffffffffea0;
    f_02.derivatives_[1][2] = (real_t)(int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
    f_02.derivatives_[2][2] = local_150;
    beta_01.derivatives_[0][1] = (real_t)in_stack_fffffffffffffdfc;
    beta_01.derivatives_[0][0] = in_stack_fffffffffffffdf8;
    beta_01.derivatives_._8_8_ = poVar4;
    beta_01.derivatives_[1]._4_8_ = poVar5;
    beta_01.derivatives_[2]._0_8_ = in_stack_fffffffffffffe10;
    beta_01.derivatives_[2][2] = in_stack_fffffffffffffe18;
    rVar7 = ising::free_energy::
            specific_heat<ising::free_energy::square::transfer_matrix<float>::result_t,ising::free_energy::square::transfer_matrix<float>::result_t,float>
                      (f_02,beta_01,SUB84(local_148._24_8_,4));
    poVar4 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe10,rVar7);
    poVar4 = std::operator<<(poVar4,' ');
    in_stack_fffffffffffffe18 = SUB84(poVar4,0);
    uStack_1e4 = (undefined4)((ulong)poVar4 >> 0x20);
    memcpy(&stack0xfffffffffffffe68,local_5c,0x24);
    memcpy(local_1c0,&local_80,0x24);
    f_03.derivatives_[0][1] = (real_t)in_stack_fffffffffffffe64;
    f_03.derivatives_[0][0] = (real_t)in_stack_fffffffffffffe60;
    f_03.derivatives_[0][2] = (real_t)(int)in_stack_fffffffffffffe68;
    f_03.derivatives_[1][0] = (real_t)(int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    f_03.derivatives_[1][1] = (real_t)(int)in_stack_fffffffffffffe70;
    f_03.derivatives_[1][2] = (real_t)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
    f_03.derivatives_[2][0] = (real_t)(int)in_stack_fffffffffffffe78;
    f_03.derivatives_[2][1] = (real_t)(int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    f_03.derivatives_[2][2] = in_stack_fffffffffffffe80;
    beta_02.derivatives_[0][1] = (real_t)in_stack_fffffffffffffe8c;
    beta_02.derivatives_[0][0] = (real_t)in_stack_fffffffffffffe88;
    beta_02.derivatives_[0][2] = (real_t)(int)in_stack_fffffffffffffe90;
    beta_02.derivatives_[1][0] = (real_t)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
    beta_02.derivatives_[1][1] = (real_t)(int)in_stack_fffffffffffffe98;
    beta_02.derivatives_[1][2] = (real_t)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    beta_02.derivatives_[2][0] = (real_t)(int)in_stack_fffffffffffffea0;
    beta_02.derivatives_[2][1] = (real_t)(int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
    beta_02.derivatives_[2][2] = in_stack_fffffffffffffea8;
    rVar7 = ising::free_energy::
            magnetization2<ising::free_energy::square::transfer_matrix<float>::result_t,ising::free_energy::square::transfer_matrix<float>::result_t,float>
                      (f_03,beta_02,in_stack_fffffffffffffe54);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)CONCAT44(uStack_1e4,in_stack_fffffffffffffe18),rVar7);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void calc(const options2f& opt) {
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N M2/N2\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    real_t h = 0;
    auto f =
        square::transfer_matrix<real_t>::calc(opt.Lx, opt.Ly, Jx, Jy, 1 / t, h);
    typename square::transfer_matrix<real_t>::result_t beta;
    beta.set(0, 1 / t);
    std::cout << opt.Lx << ' ' << opt.Ly << ' ' << Jx << ' ' << Jy << ' ' << t
              << ' ' << (1 / t) << ' ' << free_energy(f, beta, h) << ' '
              << energy(f, beta, h) << ' ' << specific_heat(f, beta, h) << ' '
              << magnetization2(f, beta, h) << std::endl;
  }
}